

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

bool __thiscall QFileSystemModel::hasChildren(QFileSystemModel *this,QModelIndex *parent)

{
  QExtendedInformation *this_00;
  long lVar1;
  Type TVar2;
  
  if (parent->c < 1) {
    if (parent->c != 0) {
      return true;
    }
    if (parent->r < 0) {
      return true;
    }
    if ((parent->m).ptr == (QAbstractItemModel *)0x0) {
      return true;
    }
    this_00 = *(QExtendedInformation **)(parent->i + 0x38);
    if (this_00 != (QExtendedInformation *)0x0) {
      TVar2 = QExtendedInformation::type(this_00);
      return TVar2 == Dir;
    }
    lVar1 = *(long *)(parent->i + 0x18);
    if (lVar1 != 0) {
      return 0 < *(long *)(lVar1 + 8);
    }
  }
  return false;
}

Assistant:

bool QFileSystemModel::hasChildren(const QModelIndex &parent) const
{
    Q_D(const QFileSystemModel);
    if (parent.column() > 0)
        return false;

    if (!parent.isValid()) // drives
        return true;

    const QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(parent);
    Q_ASSERT(indexNode);
    return (indexNode->isDir());
}